

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

Sfm_Ntk_t *
Sfm_NtkConstruct(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed,Vec_Str_t *vEmpty,
                Vec_Wrd_t *vTruths,Vec_Int_t *vStarts,Vec_Wrd_t *vTruths2)

{
  uint uVar1;
  Sfm_Ntk_t *p;
  int *piVar2;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *pVVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  Sfm_CheckConsistency(vFanins,nPis,nPos,vFixed);
  p = (Sfm_Ntk_t *)calloc(1,0x1d0);
  iVar6 = vFanins->nSize;
  p->nObjs = iVar6;
  p->nPis = nPis;
  p->nPos = nPos;
  p->nNodes = iVar6 - (nPos + nPis);
  p->vFixed = vFixed;
  p->vEmpty = vEmpty;
  p->vTruths = vTruths;
  iVar6 = vFanins->nSize;
  pVVar3 = vFanins->pArray;
  (p->vFanins).nCap = vFanins->nCap;
  (p->vFanins).nSize = iVar6;
  (p->vFanins).pArray = pVVar3;
  p->vStarts = vStarts;
  p->vTruths2 = vTruths2;
  free(vFanins);
  Sfm_CreateFanout(&p->vFanins,&p->vFanouts);
  Sfm_CreateLevel(&p->vFanins,&p->vLevels,vEmpty);
  Sfm_CreateLevelR(&p->vFanouts,&p->vLevelsR,vEmpty);
  uVar1 = p->nObjs;
  uVar5 = (ulong)uVar1;
  lVar7 = (long)(int)uVar1;
  if ((p->vCounts).nCap < (int)uVar1) {
    piVar2 = (p->vCounts).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc(lVar7 * 4);
    }
    else {
      piVar2 = (int *)realloc(piVar2,lVar7 * 4);
    }
    (p->vCounts).pArray = piVar2;
    if (piVar2 == (int *)0x0) goto LAB_00539322;
    (p->vCounts).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCounts).pArray,0,uVar5 * 4);
  }
  (p->vCounts).nSize = uVar1;
  if ((p->vTravIds).nCap < (int)uVar1) {
    piVar2 = (p->vTravIds).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc(lVar7 * 4);
    }
    else {
      piVar2 = (int *)realloc(piVar2,lVar7 * 4);
    }
    (p->vTravIds).pArray = piVar2;
    if (piVar2 == (int *)0x0) goto LAB_00539322;
    (p->vTravIds).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vTravIds).pArray,0,uVar5 * 4);
  }
  (p->vTravIds).nSize = uVar1;
  if ((p->vTravIds2).nCap < (int)uVar1) {
    piVar2 = (p->vTravIds2).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc(lVar7 * 4);
    }
    else {
      piVar2 = (int *)realloc(piVar2,lVar7 * 4);
    }
    (p->vTravIds2).pArray = piVar2;
    if (piVar2 == (int *)0x0) goto LAB_00539322;
    (p->vTravIds2).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vTravIds2).pArray,0,uVar5 * 4);
  }
  (p->vTravIds2).nSize = uVar1;
  iVar6 = (int)(lVar7 * 2);
  if ((p->vId2Var).nCap < iVar6) {
    piVar2 = (p->vId2Var).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc(lVar7 << 3);
    }
    else {
      piVar2 = (int *)realloc(piVar2,lVar7 << 3);
    }
    (p->vId2Var).pArray = piVar2;
    if (piVar2 == (int *)0x0) goto LAB_00539322;
    (p->vId2Var).nCap = iVar6;
  }
  uVar5 = lVar7 * 2 & 0xffffffff;
  if (0 < (int)uVar1) {
    memset((p->vId2Var).pArray,0xff,uVar5 * 4);
  }
  (p->vId2Var).nSize = iVar6;
  if ((p->vVar2Id).nCap < iVar6) {
    piVar2 = (p->vVar2Id).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar6 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)iVar6 << 2);
    }
    (p->vVar2Id).pArray = piVar2;
    if (piVar2 == (int *)0x0) {
LAB_00539322:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vVar2Id).nCap = iVar6;
  }
  if (0 < (int)uVar1) {
    memset((p->vVar2Id).pArray,0xff,uVar5 << 2);
  }
  (p->vVar2Id).nSize = iVar6;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10000;
  pVVar3->nSize = 0;
  piVar2 = (int *)malloc(0x40000);
  pVVar3->pArray = piVar2;
  p->vCover = pVVar3;
  pVVar4 = Sfm_CreateCnf(p);
  p->vCnfs = pVVar4;
  return p;
}

Assistant:

Sfm_Ntk_t * Sfm_NtkConstruct( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed, Vec_Str_t * vEmpty, Vec_Wrd_t * vTruths, Vec_Int_t * vStarts, Vec_Wrd_t * vTruths2 )
{
    Sfm_Ntk_t * p;
    Sfm_CheckConsistency( vFanins, nPis, nPos, vFixed );
    p = ABC_CALLOC( Sfm_Ntk_t, 1 );
    p->nObjs    = Vec_WecSize( vFanins );
    p->nPis     = nPis;
    p->nPos     = nPos;
    p->nNodes   = p->nObjs - p->nPis - p->nPos;
    // user data
    p->vFixed   = vFixed;
    p->vEmpty   = vEmpty;
    p->vTruths  = vTruths;
    p->vFanins  = *vFanins;
    p->vStarts  = vStarts;
    p->vTruths2 = vTruths2;
    ABC_FREE( vFanins );
    // attributes
    Sfm_CreateFanout( &p->vFanins, &p->vFanouts );
    Sfm_CreateLevel( &p->vFanins, &p->vLevels, vEmpty );
    Sfm_CreateLevelR( &p->vFanouts, &p->vLevelsR, vEmpty );
    Vec_IntFill( &p->vCounts,   p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds,  p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds2, p->nObjs,  0 );
    Vec_IntFill( &p->vId2Var,   2*p->nObjs, -1 );
    Vec_IntFill( &p->vVar2Id,   2*p->nObjs, -1 );
    p->vCover   = Vec_IntAlloc( 1 << 16 );
    p->vCnfs    = Sfm_CreateCnf( p );
    return p;
}